

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImGui::RenderColorRectWithAlphaCheckerboard
               (ImDrawList *draw_list,ImVec2 p_min,ImVec2 p_max,ImU32 col,float grid_step,
               ImVec2 grid_off,float rounding,int rounding_corners_flags)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  byte bVar4;
  byte bVar5;
  ImU32 IVar6;
  byte in_DL;
  uint in_ESI;
  undefined8 in_RDI;
  float _y;
  float _y_00;
  float _x;
  float _x_00;
  undefined1 in_ZMM0 [64];
  undefined1 in_ZMM1 [64];
  float in_XMM2_Da;
  undefined1 in_XMM3 [16];
  ImDrawCornerFlags in_XMM4_Da;
  int rounding_corners_flags_cell;
  float x2;
  float x1;
  float x;
  float y2;
  float y1;
  float y;
  int yi;
  ImU32 col_bg2;
  ImU32 col_bg1;
  ImU32 in_stack_ffffffffffffff80;
  ImU32 in_stack_ffffffffffffff84;
  ImDrawCornerFlags rounding_corners;
  undefined8 in_stack_ffffffffffffff88;
  undefined8 uVar7;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  ImVec2 in_stack_ffffffffffffff98;
  ImVec2 in_stack_ffffffffffffffa0;
  float local_4c;
  float local_40;
  float local_18;
  float fStack_14;
  float local_10;
  float fStack_c;
  float local_8;
  float fStack_4;
  
  uVar1 = vmovlpd_avx(in_ZMM0._0_16_);
  uVar2 = vmovlpd_avx(in_ZMM1._0_16_);
  uVar3 = vmovlpd_avx(in_XMM3);
  if (in_ESI >> 0x18 < 0xff) {
    IVar6 = ImAlphaBlendColors(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
    GetColorU32(IVar6);
    IVar6 = ImAlphaBlendColors(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
    IVar6 = GetColorU32(IVar6);
    ImDrawList::AddRectFilled
              ((ImDrawList *)in_stack_ffffffffffffffa0,(ImVec2 *)in_stack_ffffffffffffff98,
               (ImVec2 *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (ImU32)((ulong)in_stack_ffffffffffffff88 >> 0x20),(float)in_stack_ffffffffffffff88,
               in_stack_ffffffffffffff84);
    bVar4 = 0;
    fStack_4 = (float)((ulong)uVar1 >> 0x20);
    fStack_14 = (float)((ulong)uVar3 >> 0x20);
    for (local_40 = fStack_4 + fStack_14; fStack_c = (float)((ulong)uVar2 >> 0x20),
        local_40 < fStack_c; local_40 = in_XMM2_Da + local_40) {
      _y = ImClamp<float>(local_40,fStack_4,fStack_c);
      _y_00 = ImMin<float>(local_40 + in_XMM2_Da,fStack_c);
      if (_y < _y_00) {
        local_8 = (float)uVar1;
        local_18 = (float)uVar3;
        for (local_4c = (float)bVar4 * in_XMM2_Da + local_8 + local_18; local_10 = (float)uVar2,
            local_4c < local_10; local_4c = in_XMM2_Da + in_XMM2_Da + local_4c) {
          _x = ImClamp<float>(local_4c,local_8,local_10);
          _x_00 = ImMin<float>(local_4c + in_XMM2_Da,local_10);
          if (_x < _x_00) {
            bVar5 = 0;
            if ((_y <= fStack_4) && (bVar5 = _x <= local_8, local_10 <= _x_00)) {
              bVar5 = bVar5 | 2;
            }
            if (fStack_c <= _y_00) {
              if (_x <= local_8) {
                bVar5 = bVar5 | 4;
              }
              if (local_10 <= _x_00) {
                bVar5 = bVar5 | 8;
              }
            }
            uVar7 = in_RDI;
            ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffa0,_x,_y);
            ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff98,_x_00,_y_00);
            rounding_corners = in_XMM4_Da;
            if ((in_DL & bVar5) == 0) {
              rounding_corners = 0;
            }
            ImDrawList::AddRectFilled
                      ((ImDrawList *)in_stack_ffffffffffffffa0,(ImVec2 *)in_stack_ffffffffffffff98,
                       (ImVec2 *)CONCAT44(IVar6,in_stack_ffffffffffffff90),
                       (ImU32)((ulong)uVar7 >> 0x20),(float)uVar7,rounding_corners);
          }
        }
      }
      bVar4 = bVar4 ^ 1;
    }
  }
  else {
    ImDrawList::AddRectFilled
              ((ImDrawList *)in_stack_ffffffffffffffa0,(ImVec2 *)in_stack_ffffffffffffff98,
               (ImVec2 *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (ImU32)((ulong)in_stack_ffffffffffffff88 >> 0x20),(float)in_stack_ffffffffffffff88,
               in_stack_ffffffffffffff84);
  }
  return;
}

Assistant:

void ImGui::RenderColorRectWithAlphaCheckerboard(ImDrawList* draw_list, ImVec2 p_min, ImVec2 p_max, ImU32 col, float grid_step, ImVec2 grid_off, float rounding, int rounding_corners_flags)
{
    if (((col & IM_COL32_A_MASK) >> IM_COL32_A_SHIFT) < 0xFF)
    {
        ImU32 col_bg1 = ImGui::GetColorU32(ImAlphaBlendColors(IM_COL32(204, 204, 204, 255), col));
        ImU32 col_bg2 = ImGui::GetColorU32(ImAlphaBlendColors(IM_COL32(128, 128, 128, 255), col));
        draw_list->AddRectFilled(p_min, p_max, col_bg1, rounding, rounding_corners_flags);

        int yi = 0;
        for (float y = p_min.y + grid_off.y; y < p_max.y; y += grid_step, yi++)
        {
            float y1 = ImClamp(y, p_min.y, p_max.y), y2 = ImMin(y + grid_step, p_max.y);
            if (y2 <= y1)
                continue;
            for (float x = p_min.x + grid_off.x + (yi & 1) * grid_step; x < p_max.x; x += grid_step * 2.0f)
            {
                float x1 = ImClamp(x, p_min.x, p_max.x), x2 = ImMin(x + grid_step, p_max.x);
                if (x2 <= x1)
                    continue;
                int rounding_corners_flags_cell = 0;
                if (y1 <= p_min.y) { if (x1 <= p_min.x) rounding_corners_flags_cell |= ImDrawCornerFlags_TopLeft; if (x2 >= p_max.x) rounding_corners_flags_cell |= ImDrawCornerFlags_TopRight; }
                if (y2 >= p_max.y) { if (x1 <= p_min.x) rounding_corners_flags_cell |= ImDrawCornerFlags_BotLeft; if (x2 >= p_max.x) rounding_corners_flags_cell |= ImDrawCornerFlags_BotRight; }
                rounding_corners_flags_cell &= rounding_corners_flags;
                draw_list->AddRectFilled(ImVec2(x1, y1), ImVec2(x2, y2), col_bg2, rounding_corners_flags_cell ? rounding : 0.0f, rounding_corners_flags_cell);
            }
        }
    }
    else
    {
        draw_list->AddRectFilled(p_min, p_max, col, rounding, rounding_corners_flags);
    }
}